

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_h_predictor_4x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  short sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar16;
  byte bVar20;
  ushort uVar22;
  undefined1 auVar17 [16];
  byte bVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  bVar21 = top_row[3];
  uVar1 = *(undefined4 *)left_column;
  bVar20 = (byte)((uint)uVar1 >> 0x18);
  uVar6 = (ushort)(byte)((uint)uVar1 >> 8);
  uVar16 = (ushort)uVar1 & 0xff;
  auVar2[0xc] = bVar20;
  auVar2._0_12_ = ZEXT812(0);
  uVar22 = (ushort)(byte)((uint)uVar1 >> 0x10);
  iVar7 = bVar21 + 0x800080;
  iVar8 = (ushort)((ushort)bVar21 * 0x6b) + 0x800080;
  iVar9 = (ushort)((ushort)bVar21 * 0xab) + 0x800080;
  iVar10 = (ushort)((ushort)bVar21 * 0xc0) + 0x800080;
  auVar23._0_4_ = (uint)(ushort)(uVar16 * 0xff) + iVar7;
  auVar23._4_4_ = (uint)(ushort)(uVar16 * 0x95) + iVar8;
  auVar23._8_4_ = (uint)(ushort)(uVar16 * 0x55) + iVar9;
  auVar23._12_4_ = (uint)(ushort)(uVar16 * 0x40) + iVar10;
  auVar11 = ZEXT416(0xd090501);
  auVar24 = pshufb(auVar23,auVar11);
  *(int *)dst = auVar24._0_4_;
  auVar25._0_4_ = (uint)(ushort)(uVar6 * 0xff) + iVar7;
  auVar25._4_4_ = (uint)(ushort)(uVar6 * 0x95) + iVar8;
  auVar25._8_4_ = (uint)(ushort)(uVar6 * 0x55) + iVar9;
  auVar25._12_4_ = (uint)(ushort)(uVar6 * 0x40) + iVar10;
  auVar24 = pshufb(auVar25,auVar11);
  *(int *)(dst + stride) = auVar24._0_4_;
  auVar26._0_4_ = (uint)(ushort)(uVar22 * 0xff) + iVar7;
  auVar26._4_4_ = (uint)(ushort)(uVar22 * 0x95) + iVar8;
  auVar26._8_4_ = (uint)(ushort)(uVar22 * 0x55) + iVar9;
  auVar26._12_4_ = (uint)(ushort)(uVar22 * 0x40) + iVar10;
  auVar24 = pshufb(auVar26,auVar11);
  *(int *)(dst + stride * 2) = auVar24._0_4_;
  sVar12 = (short)(auVar2._10_3_ >> 0x10);
  auVar17._0_4_ = (uint)(ushort)(sVar12 * 0xff) + iVar7;
  auVar17._4_4_ = (uint)(ushort)((ushort)bVar20 * 0x95) + iVar8;
  auVar17._8_4_ = (uint)(ushort)(sVar12 * 0x55) + iVar9;
  auVar17._12_4_ = (uint)(ushort)(sVar12 * 0x40) + iVar10;
  auVar24 = pshufb(auVar17,auVar11);
  *(int *)(dst + stride * 3) = auVar24._0_4_;
  uVar1 = *(undefined4 *)(left_column + 4);
  bVar21 = (byte)((uint)uVar1 >> 0x18);
  uVar6 = (ushort)(byte)((uint)uVar1 >> 8);
  uVar16 = (ushort)uVar1 & 0xff;
  auVar3[0xc] = bVar21;
  auVar3._0_12_ = ZEXT812(0);
  uVar22 = (ushort)(byte)((uint)uVar1 >> 0x10);
  auVar27._0_4_ = (uint)(ushort)(uVar16 * 0xff) + iVar7;
  auVar27._4_4_ = (uint)(ushort)(uVar16 * 0x95) + iVar8;
  auVar27._8_4_ = (uint)(ushort)(uVar16 * 0x55) + iVar9;
  auVar27._12_4_ = (uint)(ushort)(uVar16 * 0x40) + iVar10;
  auVar24 = pshufb(auVar27,auVar11);
  *(int *)(dst + stride * 4) = auVar24._0_4_;
  auVar28._0_4_ = (uint)(ushort)(uVar6 * 0xff) + iVar7;
  auVar28._4_4_ = (uint)(ushort)(uVar6 * 0x95) + iVar8;
  auVar28._8_4_ = (uint)(ushort)(uVar6 * 0x55) + iVar9;
  auVar28._12_4_ = (uint)(ushort)(uVar6 * 0x40) + iVar10;
  auVar24 = pshufb(auVar28,auVar11);
  *(int *)(dst + stride * 5) = auVar24._0_4_;
  auVar29._0_4_ = (uint)(ushort)(uVar22 * 0xff) + iVar7;
  auVar29._4_4_ = (uint)(ushort)(uVar22 * 0x95) + iVar8;
  auVar29._8_4_ = (uint)(ushort)(uVar22 * 0x55) + iVar9;
  auVar29._12_4_ = (uint)(ushort)(uVar22 * 0x40) + iVar10;
  auVar24 = pshufb(auVar29,auVar11);
  *(int *)(dst + stride * 6) = auVar24._0_4_;
  sVar12 = (short)(auVar3._10_3_ >> 0x10);
  auVar18._0_4_ = (uint)(ushort)(sVar12 * 0xff) + iVar7;
  auVar18._4_4_ = (uint)(ushort)((ushort)bVar21 * 0x95) + iVar8;
  auVar18._8_4_ = (uint)(ushort)(sVar12 * 0x55) + iVar9;
  auVar18._12_4_ = (uint)(ushort)(sVar12 * 0x40) + iVar10;
  auVar24 = pshufb(auVar18,auVar11);
  *(int *)(dst + stride * 7) = auVar24._0_4_;
  uVar1 = *(undefined4 *)(left_column + 8);
  bVar21 = (byte)((uint)uVar1 >> 0x18);
  uVar6 = (ushort)(byte)((uint)uVar1 >> 8);
  uVar16 = (ushort)uVar1 & 0xff;
  auVar4[0xc] = bVar21;
  auVar4._0_12_ = ZEXT812(0);
  uVar22 = (ushort)(byte)((uint)uVar1 >> 0x10);
  auVar30._0_4_ = (uint)(ushort)(uVar16 * 0xff) + iVar7;
  auVar30._4_4_ = (uint)(ushort)(uVar16 * 0x95) + iVar8;
  auVar30._8_4_ = (uint)(ushort)(uVar16 * 0x55) + iVar9;
  auVar30._12_4_ = (uint)(ushort)(uVar16 * 0x40) + iVar10;
  auVar24 = pshufb(auVar30,auVar11);
  *(int *)(dst + stride * 8) = auVar24._0_4_;
  auVar31._0_4_ = (uint)(ushort)(uVar6 * 0xff) + iVar7;
  auVar31._4_4_ = (uint)(ushort)(uVar6 * 0x95) + iVar8;
  auVar31._8_4_ = (uint)(ushort)(uVar6 * 0x55) + iVar9;
  auVar31._12_4_ = (uint)(ushort)(uVar6 * 0x40) + iVar10;
  auVar24 = pshufb(auVar31,auVar11);
  *(int *)(dst + stride * 9) = auVar24._0_4_;
  auVar32._0_4_ = (uint)(ushort)(uVar22 * 0xff) + iVar7;
  auVar32._4_4_ = (uint)(ushort)(uVar22 * 0x95) + iVar8;
  auVar32._8_4_ = (uint)(ushort)(uVar22 * 0x55) + iVar9;
  auVar32._12_4_ = (uint)(ushort)(uVar22 * 0x40) + iVar10;
  auVar24 = pshufb(auVar32,auVar11);
  *(int *)(dst + stride * 10) = auVar24._0_4_;
  sVar12 = (short)(auVar4._10_3_ >> 0x10);
  auVar19._0_4_ = (uint)(ushort)(sVar12 * 0xff) + iVar7;
  auVar19._4_4_ = (uint)(ushort)((ushort)bVar21 * 0x95) + iVar8;
  auVar19._8_4_ = (uint)(ushort)(sVar12 * 0x55) + iVar9;
  auVar19._12_4_ = (uint)(ushort)(sVar12 * 0x40) + iVar10;
  auVar24 = pshufb(auVar19,auVar11);
  *(int *)(dst + stride * 0xb) = auVar24._0_4_;
  uVar1 = *(undefined4 *)(left_column + 0xc);
  bVar21 = (byte)((uint)uVar1 >> 0x18);
  uVar6 = (ushort)(byte)((uint)uVar1 >> 8);
  uVar16 = (ushort)uVar1 & 0xff;
  auVar5[0xc] = bVar21;
  auVar5._0_12_ = ZEXT812(0);
  uVar22 = (ushort)(byte)((uint)uVar1 >> 0x10);
  auVar24._0_4_ = (uint)(ushort)(uVar16 * 0xff) + iVar7;
  auVar24._4_4_ = (uint)(ushort)(uVar16 * 0x95) + iVar8;
  auVar24._8_4_ = (uint)(ushort)(uVar16 * 0x55) + iVar9;
  auVar24._12_4_ = (uint)(ushort)(uVar16 * 0x40) + iVar10;
  auVar24 = pshufb(auVar24,auVar11);
  *(int *)(dst + stride * 0xc) = auVar24._0_4_;
  auVar13._0_4_ = (uint)(ushort)(uVar6 * 0xff) + iVar7;
  auVar13._4_4_ = (uint)(ushort)(uVar6 * 0x95) + iVar8;
  auVar13._8_4_ = (uint)(ushort)(uVar6 * 0x55) + iVar9;
  auVar13._12_4_ = (uint)(ushort)(uVar6 * 0x40) + iVar10;
  auVar24 = pshufb(auVar13,auVar11);
  *(int *)(dst + stride * 0xd) = auVar24._0_4_;
  auVar14._0_4_ = (uint)(ushort)(uVar22 * 0xff) + iVar7;
  auVar14._4_4_ = (uint)(ushort)(uVar22 * 0x95) + iVar8;
  auVar14._8_4_ = (uint)(ushort)(uVar22 * 0x55) + iVar9;
  auVar14._12_4_ = (uint)(ushort)(uVar22 * 0x40) + iVar10;
  auVar24 = pshufb(auVar14,auVar11);
  *(int *)(dst + stride * 0xe) = auVar24._0_4_;
  sVar12 = (short)(auVar5._10_3_ >> 0x10);
  auVar15._0_4_ = (uint)(ushort)(sVar12 * 0xff) + iVar7;
  auVar15._4_4_ = (uint)(ushort)((ushort)bVar21 * 0x95) + iVar8;
  auVar15._8_4_ = (uint)(ushort)(sVar12 * 0x55) + iVar9;
  auVar15._12_4_ = (uint)(ushort)(sVar12 * 0x40) + iVar10;
  auVar11 = pshufb(auVar15,auVar11);
  *(int *)(dst + stride * 0xf) = auVar11._0_4_;
  return;
}

Assistant:

void aom_smooth_h_predictor_4x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi32(top_row[3]);
  const __m128i weights = cvtepu8_epi32(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi32(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi32(Load4(left_column));
  __m128i left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 4));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 8));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 12));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
}